

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.cc
# Opt level: O3

void __thiscall
Builder::Builder(Builder *this,State *state,BuildConfig *config,BuildLog *build_log,
                DepsLog *deps_log,DiskInterface *disk_interface,Status *status,
                int64_t start_time_millis)

{
  _Rb_tree_header *p_Var1;
  
  this->state_ = state;
  this->config_ = config;
  p_Var1 = &(this->plan_).want_._M_t._M_impl.super__Rb_tree_header;
  (this->plan_).want_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->plan_).want_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->plan_).want_._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->plan_).want_._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->plan_).want_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->plan_).ready_._M_t._M_impl.super__Rb_tree_header;
  (this->plan_).ready_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->plan_).ready_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->plan_).ready_._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->plan_).ready_._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->plan_).ready_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->plan_).builder_ = this;
  (this->plan_).command_edges_ = 0;
  (this->plan_).wanted_edges_ = 0;
  (this->command_runner_)._M_t.
  super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
  super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
  super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl = (CommandRunner *)0x0;
  this->status_ = status;
  p_Var1 = &(this->running_edges_)._M_t._M_impl.super__Rb_tree_header;
  (this->running_edges_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->running_edges_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->running_edges_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->running_edges_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->running_edges_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->start_time_millis_ = start_time_millis;
  this->disk_interface_ = disk_interface;
  (this->scan_).build_log_ = build_log;
  (this->scan_).disk_interface_ = disk_interface;
  (this->scan_).dep_loader_._vptr_ImplicitDepLoader = (_func_int **)&PTR_ProcessDepfileDeps_00135ab0
  ;
  (this->scan_).dep_loader_.state_ = state;
  (this->scan_).dep_loader_.disk_interface_ = disk_interface;
  (this->scan_).dep_loader_.deps_log_ = deps_log;
  (this->scan_).dep_loader_.depfile_parser_options_ = (DepfileParserOptions *)(config + 0x20);
  (this->scan_).dyndep_loader_.state_ = state;
  (this->scan_).dyndep_loader_.disk_interface_ = disk_interface;
  return;
}

Assistant:

Builder::Builder(State* state, const BuildConfig& config,
                 BuildLog* build_log, DepsLog* deps_log,
                 DiskInterface* disk_interface, Status *status,
                 int64_t start_time_millis)
    : state_(state), config_(config), plan_(this), status_(status),
      start_time_millis_(start_time_millis), disk_interface_(disk_interface),
      scan_(state, build_log, deps_log, disk_interface,
            &config_.depfile_parser_options) {
}